

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

ByteData * __thiscall
cfd::core::ExtPubkey::GetVersionData(ByteData *__return_storage_ptr__,ExtPubkey *this)

{
  allocator_type local_31;
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_data;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&byte_data,4,&local_31);
  *byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = *(uchar *)((long)&this->version_ + 3);
  byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = *(uchar *)((long)&this->version_ + 2);
  byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = *(uchar *)((long)&this->version_ + 1);
  byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[3] = (uchar)this->version_;
  ByteData::ByteData(__return_storage_ptr__,&byte_data);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return __return_storage_ptr__;
}

Assistant:

ByteData ExtPubkey::GetVersionData() const {
  std::vector<uint8_t> byte_data(4);
  byte_data[0] = (version_ >> 24) & 0xff;
  byte_data[1] = (version_ >> 16) & 0xff;
  byte_data[2] = (version_ >> 8) & 0xff;
  byte_data[3] = version_ & 0xff;
  return ByteData(byte_data);
}